

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

Gia_Man_t * Jf_ManDeriveMappingGia(Jf_Man_t *p)

{
  Jf_Par_t *pJVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  undefined8 uVar4;
  word *pwVar5;
  Vec_Mem_t *pVVar6;
  Vec_Int_t *p_00;
  uint uVar7;
  int iVar8;
  uint *__ptr;
  Vec_Int_t *pVVar9;
  int *piVar10;
  Vec_Int_t *pVVar11;
  Vec_Int_t *p_01;
  Gia_Man_t *p_02;
  size_t sVar12;
  char *pcVar13;
  Gia_Obj_t *pGVar14;
  Cnf_Dat_t *pCVar15;
  int Fill;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  Gia_Man_t *pGVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  word uTruth;
  undefined4 *local_78;
  Vec_Int_t *local_68;
  Vec_Int_t *local_60;
  word local_50;
  word *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  uVar7 = p->pGia->nObjs;
  __ptr = (uint *)malloc(0x10);
  uVar21 = 0x10;
  if (0xe < uVar7 - 1) {
    uVar21 = uVar7;
  }
  *__ptr = uVar21;
  if (uVar21 == 0) {
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[1] = uVar7;
LAB_00765482:
    local_78 = (undefined4 *)0x0;
  }
  else {
    local_78 = (undefined4 *)malloc((long)(int)uVar21 << 2);
    *(undefined4 **)(__ptr + 2) = local_78;
    __ptr[1] = uVar7;
    if (local_78 == (undefined4 *)0x0) goto LAB_00765482;
    memset(local_78,0xff,(long)(int)uVar7 << 2);
  }
  pJVar1 = p->pPars;
  iVar22 = (int)pJVar1->Area;
  iVar23 = (int)pJVar1->Edge;
  iVar8 = iVar23 + (iVar22 + uVar7) * 2;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  iVar19 = 0x10;
  if (0xe < (iVar23 + (iVar22 + uVar7) * 2) - 1) {
    iVar19 = iVar8;
  }
  pVVar9->nCap = iVar19;
  if (iVar19 == 0) {
    pVVar9->pArray = (int *)0x0;
    pVVar9->nSize = iVar8;
  }
  else {
    piVar10 = (int *)malloc((long)iVar19 << 2);
    pVVar9->pArray = piVar10;
    pVVar9->nSize = iVar8;
    if (piVar10 != (int *)0x0) {
      memset(piVar10,0,(long)iVar8 << 2);
      iVar22 = (int)pJVar1->Area;
      iVar23 = (int)pJVar1->Edge;
    }
  }
  iVar19 = iVar23 + iVar22 * 2 + 1000;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar23 + iVar22 * 2 + 999U) {
    iVar8 = iVar19;
  }
  pVVar11->nCap = iVar8;
  local_38 = pVVar11;
  if (iVar8 == 0) {
    pVVar11->pArray = (int *)0x0;
    pVVar11->nSize = iVar19;
  }
  else {
    piVar10 = (int *)malloc((long)iVar8 << 2);
    pVVar11->pArray = piVar10;
    pVVar11->nSize = iVar19;
    if (piVar10 != (int *)0x0) {
      memset(piVar10,0,(long)iVar19 << 2);
    }
  }
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 0x10000;
  pVVar11->nSize = 0;
  piVar10 = (int *)malloc(0x40000);
  pVVar11->pArray = piVar10;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 0x10;
  p_01->nSize = 0;
  piVar10 = (int *)malloc(0x40);
  p_01->pArray = piVar10;
  local_50 = 0;
  if (pJVar1->fCutMin == 0) {
    __assert_fail("p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x5a3,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
  }
  local_40 = pVVar9;
  if (pJVar1->fGenCnf == 0) {
    local_60 = (Vec_Int_t *)0x0;
    local_68 = (Vec_Int_t *)0x0;
    uVar21 = uVar7;
  }
  else {
    local_60 = (Vec_Int_t *)malloc(0x10);
    local_60->nCap = 1000;
    local_60->nSize = 0;
    piVar10 = (int *)malloc(4000);
    local_60->pArray = piVar10;
    local_68 = (Vec_Int_t *)malloc(0x10);
    local_68->nCap = 1000;
    local_68->nSize = 0;
    piVar10 = (int *)malloc(4000);
    local_68->pArray = piVar10;
    Vec_IntPush(local_68,0);
    Vec_IntPush(local_60,1);
    uVar21 = p->pGia->nObjs;
  }
  p_02 = Gia_ManStart(uVar21);
  pGVar20 = p->pGia;
  pcVar2 = pGVar20->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pcVar2);
    pcVar13 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar13,pcVar2);
  }
  p_02->pName = pcVar13;
  pcVar2 = pGVar20->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pcVar2);
    pcVar13 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar13,pcVar2);
  }
  p_02->pSpec = pcVar13;
  if ((int)uVar7 < 1) {
LAB_00765e86:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *local_78 = 0;
  pVVar9 = pGVar20->vCis;
  if (0 < pVVar9->nSize) {
    lVar17 = 0;
    do {
      uVar21 = pVVar9->pArray[lVar17];
      if (((long)(int)uVar21 < 0) || (pGVar20->nObjs <= (int)uVar21)) goto LAB_00765e0a;
      if (pGVar20->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar14 = Gia_ManAppendObj(p_02);
      uVar16 = *(ulong *)pGVar14;
      *(ulong *)pGVar14 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar14 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_02->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_02->pObjs;
      if ((pGVar14 < pGVar3) || (pGVar3 + p_02->nObjs <= pGVar14)) {
LAB_00765e29:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_02->vCis,(int)((ulong)((long)pGVar14 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_02->pObjs;
      if ((pGVar14 < pGVar3) || (pGVar3 + p_02->nObjs <= pGVar14)) goto LAB_00765e29;
      if (uVar7 <= uVar21) goto LAB_00765e86;
      local_78[(int)uVar21] = (int)((ulong)((long)pGVar14 - (long)pGVar3) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pGVar20 = p->pGia;
      pVVar9 = pGVar20->vCis;
    } while (lVar17 < pVVar9->nSize);
  }
  if (0 < pGVar20->nObjs) {
    local_48 = &local_50;
    lVar17 = 0;
    do {
      if (pGVar20->pObjs == (Gia_Obj_t *)0x0) break;
      uVar4 = *(undefined8 *)(pGVar20->pObjs + lVar17);
      uVar7 = (uint)uVar4;
      if (((~uVar7 & 0x1fffffff) != 0 && -1 < (int)uVar7) &&
         ((((uVar7 & 0x1fffffff) == 0x1fffffff ||
           ((uVar7 & 0x1fffffff) != ((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff))) &&
          (pGVar20->pRefs[lVar17] != 0)))) {
        if ((p->vCuts).nSize <= lVar17) goto LAB_00765e48;
        uVar7 = (p->vCuts).pArray[lVar17];
        pwVar5 = (p->pMem).pPages[(int)uVar7 >> ((byte)(p->pMem).nPageSize & 0x1f)];
        lVar18 = (long)(int)(uVar7 & (p->pMem).uPageMask);
        uVar7 = *(uint *)((long)pwVar5 + lVar18 * 8 + 4);
        uVar21 = uVar7 >> 9;
        if ((uVar7 & 0xf) == 1) {
          if (uVar21 != 1) {
            __assert_fail("Class == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                          ,0x5c3,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
          }
          uVar21 = (uint)pwVar5[lVar18 + 1];
          if (((int)uVar21 < 0) || ((int)local_78[uVar21 >> 1] < 0)) goto LAB_00765e67;
          if ((int)__ptr[1] <= lVar17) goto LAB_00765e86;
          local_78[lVar17] = local_78[uVar21 >> 1] ^ (uVar7 >> 8 ^ uVar21) & 1;
        }
        else if ((uVar7 & 0xf) == 0) {
          if (0x1ff < uVar7) {
            __assert_fail("Class == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                          ,0x5bd,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
          }
          if ((int)__ptr[1] <= lVar17) goto LAB_00765e86;
          local_78[lVar17] = uVar7 >> 8;
        }
        else {
          if (p->pPars->fFuncDsd == 0) {
            pVVar6 = p->vTtMem;
            if (pVVar6->nEntries <= (int)uVar21) {
              __assert_fail("i >= 0 && i < p->nEntries",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                            ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
            }
            local_48 = pVVar6->ppPages[uVar21 >> ((byte)pVVar6->LogPageSze & 0x1f)] +
                       (ulong)(pVVar6->PageMask & uVar21) * (long)pVVar6->nEntrySize;
          }
          else {
            local_50 = Sdm_ManReadDsdTruth(p->pDsd,uVar21);
          }
          if ((p->pDsd != (Sdm_Man_t *)0x0) &&
             (uVar7 = Sdm_ManReadDsdVarNum(p->pDsd,uVar21),
             uVar7 != (*(uint *)((long)pwVar5 + lVar18 * 8 + 4) & 0xf))) {
            __assert_fail("p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                          ,0x5cd,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
          }
          p_01->nSize = 0;
          if ((*(byte *)((long)pwVar5 + lVar18 * 8 + 4) & 0xf) == 0) {
            iVar8 = 0;
          }
          else {
            uVar16 = 0;
            do {
              uVar7 = *(uint *)((long)pwVar5 + uVar16 * 4 + lVar18 * 8 + 8);
              if (uVar7 == 0) break;
              if ((int)uVar7 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x135,"int Abc_Lit2LitL(int *, int)");
              }
              if ((int)local_78[uVar7 >> 1] < 0) goto LAB_00765e67;
              Vec_IntPush(p_01,local_78[uVar7 >> 1] ^ uVar7 & 1);
              uVar16 = uVar16 + 1;
            } while (uVar16 < (*(uint *)((long)pwVar5 + lVar18 * 8 + 4) & 0xf));
            iVar8 = p_01->nSize;
          }
          uVar7 = Kit_TruthToGia(p_02,(uint *)local_48,iVar8,pVVar11,p_01,0);
          if (p->pPars->fGenCnf != 0) {
            Jf_ManGenCnf(local_50,uVar7,p_01,local_60,local_68,pVVar11);
          }
          p_00 = local_38;
          pVVar9 = local_40;
          if ((int)uVar7 < 0) goto LAB_00765e67;
          if ((int)__ptr[1] <= lVar17) goto LAB_00765e86;
          local_78 = *(undefined4 **)(__ptr + 2);
          local_78[lVar17] = *(uint *)((long)pwVar5 + lVar18 * 8 + 4) >> 8 & 1 ^ uVar7;
          uVar7 = uVar7 >> 1;
          iVar8 = local_38->nSize;
          Vec_IntFillExtra(local_40,uVar7 + 1,(int)__ptr);
          if (pVVar9->nSize <= (int)uVar7) goto LAB_00765e86;
          pVVar9->pArray[uVar7] = iVar8;
          Vec_IntPush(p_00,p_01->nSize);
          if (0 < p_01->nSize) {
            lVar18 = 0;
            do {
              if (p_01->pArray[lVar18] < 0) goto LAB_00765ea5;
              Vec_IntPush(p_00,(uint)p_01->pArray[lVar18] >> 1);
              lVar18 = lVar18 + 1;
            } while (lVar18 < p_01->nSize);
          }
          if ((int)local_78[lVar17] < 0) {
LAB_00765ea5:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          Vec_IntPush(p_00,(uint)local_78[lVar17] >> 1);
          pGVar20 = p->pGia;
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < pGVar20->nObjs);
  }
  pVVar9 = pGVar20->vCos;
  if (pVVar9->nSize < 1) {
LAB_00765c83:
    if (local_78 != (undefined4 *)0x0) goto LAB_00765c88;
  }
  else {
    lVar17 = 0;
    do {
      iVar8 = pVVar9->pArray[lVar17];
      if (((long)iVar8 < 0) || (pGVar20->nObjs <= iVar8)) {
LAB_00765e0a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = pGVar20->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) goto LAB_00765c83;
      iVar22 = p->pPars->fGenCnf;
      if (iVar22 != 0) {
        p_01->nSize = 0;
      }
      pGVar3 = pGVar3 + iVar8;
      uVar7 = *(uint *)pGVar3;
      uVar21 = iVar8 - (uVar7 & 0x1fffffff);
      if (((int)uVar21 < 0) || ((int)__ptr[1] <= (int)uVar21)) {
LAB_00765e48:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar21 = local_78[uVar21];
      if (iVar22 == 0) {
        if ((int)uVar21 < 0) goto LAB_00765e67;
      }
      else {
        if ((int)uVar21 < 0) {
LAB_00765e67:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Vec_IntPush(p_01,uVar7 >> 0x1d & 1 ^ uVar21);
        uVar7 = *(uint *)pGVar3;
      }
      iVar8 = Gia_ManAppendCo(p_02,uVar7 >> 0x1d & 1 ^ uVar21);
      if (p->pPars->fGenCnf != 0) {
        Jf_ManGenCnf(0xaaaaaaaaaaaaaaaa,iVar8,p_01,local_60,local_68,pVVar11);
      }
      lVar17 = lVar17 + 1;
      pGVar20 = p->pGia;
      pVVar9 = pGVar20->vCos;
    } while (lVar17 < pVVar9->nSize);
LAB_00765c88:
    free(local_78);
  }
  free(__ptr);
  if (pVVar11->pArray != (int *)0x0) {
    free(pVVar11->pArray);
  }
  free(pVVar11);
  pVVar11 = local_38;
  pVVar9 = local_40;
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  uVar7 = p_02->nObjs;
  if ((int)uVar7 < pVVar9->nSize) {
    pVVar9->nSize = uVar7;
  }
  else {
    Vec_IntFillExtra(pVVar9,uVar7,Fill);
    uVar7 = p_02->nObjs;
    if (pVVar9->nSize != uVar7) {
      __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                    ,0x5f2,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
    }
  }
  if (0 < (int)uVar7) {
    piVar10 = pVVar9->pArray;
    uVar16 = 0;
    do {
      iVar8 = piVar10[uVar16];
      if (0 < iVar8) {
        piVar10[uVar16] = iVar8 + p_02->nObjs;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar7);
  }
  iVar8 = pVVar11->nSize;
  piVar10 = pVVar11->pArray;
  if ((long)iVar8 < 1) {
    if (piVar10 == (int *)0x0) goto LAB_00765d51;
  }
  else {
    lVar17 = 0;
    do {
      Vec_IntPush(pVVar9,piVar10[lVar17]);
      lVar17 = lVar17 + 1;
    } while (iVar8 != lVar17);
  }
  free(piVar10);
LAB_00765d51:
  free(pVVar11);
  if (p_02->vMapping != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x5f9,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
  }
  p_02->vMapping = pVVar9;
  Gia_ManSetRegNum(p_02,p->pGia->nRegs);
  pJVar1 = p->pPars;
  if (pJVar1->fGenCnf != 0) {
    if (pJVar1->fCnfObjIds == 0) {
      pCVar15 = Jf_ManCreateCnfRemap(p_02,local_60,local_68,pJVar1->fAddOrCla);
    }
    else {
      pCVar15 = Jf_ManCreateCnf(p_02,local_60,local_68);
    }
    p_02->pData = pCVar15;
  }
  if (local_60 != (Vec_Int_t *)0x0) {
    if (local_60->pArray != (int *)0x0) {
      free(local_60->pArray);
    }
    free(local_60);
  }
  if (local_68 != (Vec_Int_t *)0x0) {
    if (local_68->pArray != (int *)0x0) {
      free(local_68->pArray);
    }
    free(local_68);
  }
  return p_02;
}

Assistant:

Gia_Man_t * Jf_ManDeriveMappingGia( Jf_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vMapping  = Vec_IntStart( 2 * Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + 2 * (int)p->pPars->Area );
    Vec_Int_t * vMapping2 = Vec_IntStart( (int)p->pPars->Edge + 2 * (int)p->pPars->Area + 1000 );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    Vec_Int_t * vLits = NULL, * vClas = NULL;
    int i, k, iLit, Class, * pCut;
    word uTruth = 0, * pTruth = &uTruth;
    assert( p->pPars->fCutMin );
    if ( p->pPars->fGenCnf )
    {
        vLits = Vec_IntAlloc( 1000 );
        vClas = Vec_IntAlloc( 1000 );
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        Vec_IntPush( vLits, 1 );
    }
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    // map primary inputs
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachCi( p->pGia, pObj, i )
        Vec_IntWriteEntry( vCopies, Gia_ObjId(p->pGia, pObj), Gia_ManAppendCi(pNew) );
    // iterate through nodes used in the mapping
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
       if ( Gia_ObjIsBuf(pObj) || Gia_ObjRefNum(p->pGia, pObj) == 0 )
            continue;
        pCut = Jf_ObjCutBest( p, i );
//        printf( "Best cut of node %d:  ", i );  Jf_CutPrint(pCut);
        Class = Jf_CutFuncClass( pCut );
        if ( Jf_CutSize(pCut) == 0 )
        {
            assert( Class == 0 );
            Vec_IntWriteEntry( vCopies, i, Jf_CutFunc(pCut) );
            continue;
        }
        if ( Jf_CutSize(pCut) == 1 )
        {
            assert( Class == 1 );
            iLit = Abc_LitNotCond( Jf_CutLit(pCut, 1) , Jf_CutFuncCompl(pCut) );
            iLit = Abc_Lit2LitL( Vec_IntArray(vCopies), iLit );
            Vec_IntWriteEntry( vCopies, i, iLit );
            continue;
        }
        if ( p->pPars->fFuncDsd )
            uTruth = Sdm_ManReadDsdTruth(p->pDsd, Class);
        else
            pTruth = Vec_MemReadEntry(p->vTtMem, Class);
        assert( p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut) );
        // collect leaves
        Vec_IntClear( vLeaves );
        Jf_CutForEachLit( pCut, iLit, k )
            Vec_IntPush( vLeaves, Abc_Lit2LitL(Vec_IntArray(vCopies), iLit) );
        // create GIA
        iLit = Kit_TruthToGia( pNew, (unsigned *)pTruth, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
        if ( p->pPars->fGenCnf )
            Jf_ManGenCnf( uTruth, iLit, vLeaves, vLits, vClas, vCover );
        iLit = Abc_LitNotCond( iLit, Jf_CutFuncCompl(pCut) );
        Vec_IntWriteEntry( vCopies, i, iLit );
        // create mapping
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLit), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
        Vec_IntForEachEntry( vLeaves, iLit, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iLit) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(Vec_IntEntry(vCopies, i)) );
    }
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        if ( p->pPars->fGenCnf )
            Vec_IntClear( vLeaves );
        iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
        if ( p->pPars->fGenCnf )
            Vec_IntPush( vLeaves, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
        iLit = Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
        if ( p->pPars->fGenCnf )
            Jf_ManGenCnf( ABC_CONST(0xAAAAAAAAAAAAAAAA), iLit, vLeaves, vLits, vClas, vCover );
    }
    Vec_IntFree( vCopies );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, iLit, i )
        if ( iLit > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    pNew->vMapping = vMapping;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
    // derive CNF
    if ( p->pPars->fGenCnf )
    {
        if ( p->pPars->fCnfObjIds )
            pNew->pData = Jf_ManCreateCnf( pNew, vLits, vClas );
        else
            pNew->pData = Jf_ManCreateCnfRemap( pNew, vLits, vClas, p->pPars->fAddOrCla );
    }
    Vec_IntFreeP( &vLits );
    Vec_IntFreeP( &vClas );
    return pNew;
}